

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O3

node_t * __thiscall
expression_tree::node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential>::
operator=(node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> *this,
         node_t *other)

{
  node_impl<int> *pnVar1;
  node_impl<int> *in_RAX;
  long *plVar2;
  long lVar3;
  _Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false> _Var4;
  _Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false> local_18;
  
  if (this != other) {
    local_18._M_head_impl = in_RAX;
    (*((other->impl)._M_t.
       super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
       .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl)->
      _vptr_node_impl[2])(&local_18);
    _Var4._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (node_impl<int> *)0x0;
    pnVar1 = (this->impl)._M_t.
             super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
             .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
    (this->impl)._M_t.
    super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl =
         _Var4._M_head_impl;
    if (pnVar1 != (node_impl<int> *)0x0) {
      (*pnVar1->_vptr_node_impl[1])(pnVar1);
      if (local_18._M_head_impl != (node_impl<int> *)0x0) {
        (*(local_18._M_head_impl)->_vptr_node_impl[1])();
      }
      _Var4._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
    }
    if (_Var4._M_head_impl != (node_impl<int> *)0x0) {
      plVar2 = (long *)__dynamic_cast(_Var4._M_head_impl,&detail::node_impl<int>::typeinfo,
                                      &cache_on_evaluation<int,expression_tree::sequential>::branch
                                       ::typeinfo,0);
      if (plVar2 != (long *)0x0) {
        lVar3 = (**(code **)(*plVar2 + 0x38))(plVar2);
        *(node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> **)
         (lVar3 + 0x10) = this;
        lVar3 = (**(code **)(*plVar2 + 0x28))(plVar2);
        *(node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> **)
         (lVar3 + 0x10) = this;
      }
    }
    if (this->parent !=
        (node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> *)0x0) {
      modified(this->parent);
    }
  }
  return this;
}

Assistant:

node_t& operator=(const node_t& other)
	{
		if(this != &other)
		{
			impl = other.impl->clone();
			if(auto p = dynamic_cast<typename CachingPolicy<T, ThreadingPolicy>::branch*>(impl.get()))
			{
				p->left().parent = p->right().parent = this;
			}

			if(parent)
			{
				parent->modified();
			}
		}

		return *this;
	}